

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

t_debug_script * __thiscall
anon_unknown.dwarf_2f8205::t_debugger::f_find_module(t_debugger *this,wstring_view a_path)

{
  t_engine *ptVar1;
  bool bVar2;
  t_debug_script *ptVar3;
  _Base_ptr p_Var4;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  
  ptVar1 = this->v_engine;
  p_Var4 = (ptVar1->v_module__instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 ==
        &(ptVar1->v_module__instances)._M_t._M_impl.super__Rb_tree_header) {
      return (t_debug_script *)0x0;
    }
    if (((*(long *)(*(long *)(p_Var4 + 2) + 0x50) != 0) &&
        (ptVar3 = (t_debug_script *)
                  __dynamic_cast(*(long *)(*(long *)(p_Var4 + 2) + 0x50) + 0x48,
                                 &xemmai::t_module::t_body::typeinfo,
                                 &xemmai::t_debug_script::typeinfo,0),
        ptVar3 != (t_debug_script *)0x0)) &&
       (__y._M_str = (ptVar3->super_t_script).v_path._M_dataplus._M_p,
       __y._M_len = (ptVar3->super_t_script).v_path._M_string_length,
       bVar2 = std::operator==(a_path,__y), bVar2)) break;
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  }
  return ptVar3;
}

Assistant:

t_debug_script* f_find_module(std::wstring_view a_path)
	{
		for (auto& pair : v_engine.f_modules()) {
			auto& body = pair.second->f_as<t_module>().v_body;
			if (!body) continue;
			auto debug = dynamic_cast<t_debug_script*>(&body->f_as<t_module::t_body>());
			if (debug && debug->v_path == a_path) return debug;
		}
		return nullptr;
	}